

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

EbmlElement * __thiscall libebml::EbmlMaster::FindElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  pointer ppEVar1;
  EbmlElement *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t Index;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    ppEVar1 = (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ElementList).
                      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) <= uVar4) {
      return (EbmlElement *)0x0;
    }
    pEVar2 = ppEVar1[uVar4];
    iVar3 = (*pEVar2->_vptr_EbmlElement[3])(pEVar2);
    uVar4 = uVar4 + 1;
  } while ((Callbacks->GlobalId->Length != *(size_t *)((uint32 *)CONCAT44(extraout_var,iVar3) + 2))
          || (Callbacks->GlobalId->Value != *(uint32 *)CONCAT44(extraout_var,iVar3)));
  return pEVar2;
}

Assistant:

EbmlElement *EbmlMaster::FindElt(const EbmlCallbacks & Callbacks) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    EbmlElement * tmp = ElementList[Index];
    if (EbmlId(*tmp) == EBML_INFO_ID(Callbacks))
      return tmp;
  }

  return NULL;
}